

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBodyStamp.cpp
# Opt level: O2

void __thiscall OpenMD::RigidBodyStamp::RigidBodyStamp(RigidBodyStamp *this,int index)

{
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  DataHolder::DataHolder(&this->super_DataHolder);
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__RigidBodyStamp_00287b58;
  this->index_ = index;
  (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"nMembers",&local_39);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&(this->super_DataHolder).deprecatedKeywords_,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

RigidBodyStamp::RigidBodyStamp(int index) : index_(index) {
    deprecatedKeywords_.insert("nMembers");
  }